

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_FDTD_1D.cpp
# Opt level: O2

void __thiscall PP_FDTD_1D::PP_FDTD_1D(PP_FDTD_1D *this,PP_FDTD_1D *other)

{
  double dVar1;
  unsigned_long uVar2;
  
  this->_vptr_PP_FDTD_1D = (_func_int **)&PTR__PP_FDTD_1D_00115cd0;
  PP_smartAlloc::PP_smartAlloc(&this->myAllocator);
  dVar1 = other->DT;
  this->dt = other->dt;
  this->DT = dVar1;
  dVar1 = other->DZ;
  this->dz = other->dz;
  this->DZ = dVar1;
  dVar1 = other->L;
  this->R = other->R;
  this->L = dVar1;
  dVar1 = other->G;
  this->C = other->C;
  this->G = dVar1;
  uVar2 = other->Nz;
  this->Nt = other->Nt;
  this->Nz = uVar2;
  return;
}

Assistant:

PP_FDTD_1D::PP_FDTD_1D(PP_FDTD_1D const &other)
{
    this->dt = other.dt;
    this->DT = other.DT;
    this->dz = other.dz;
    this->DZ = other.DZ;
    this->R = other.R;
    this->L = other.L;
    this->C = other.C;
    this->G = other.G;
    this->Nt = other.Nt;
    this->Nz = other.Nz;

    //copy initial conditions


}